

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O1

void text_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Object *obj,
               Am_Value *new_value)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Slot_Key AVar4;
  Am_Object *this;
  Am_String orig_text;
  Am_Object inter;
  Am_String current_text;
  Am_String local_48;
  Am_Object local_40;
  Am_String local_38;
  
  local_40.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_40,pAVar2);
  if (reload_data) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
    Am_Object::Set(command_obj,0x16d,pAVar3,0);
  }
  else {
    pAVar2 = Am_Object::Get(command_obj,0x16d,0);
    Am_Object::operator=(obj,pAVar2);
  }
  local_38.data = (Am_String_Data *)0x0;
  local_48.data = (Am_String_Data *)0x0;
  this = command_obj;
  if (selective) {
    this = obj;
  }
  AVar4 = 0x169;
  if (selective) {
    AVar4 = 0xab;
  }
  pAVar2 = Am_Object::Get(this,AVar4,0);
  Am_String::operator=(&local_38,pAVar2);
  if (reload_data && !undo) {
    bVar1 = Am_Value::Valid(new_value);
    AVar4 = 0x169;
    if (bVar1) goto LAB_001bf74c;
  }
  else {
    AVar4 = (ushort)undo * 3 + 0x169;
  }
  new_value = Am_Object::Get(command_obj,AVar4,0);
LAB_001bf74c:
  Am_String::operator=(&local_48,new_value);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_48);
  Am_Object::Set(obj,0xab,pAVar3,0);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_48);
  Am_Object::Set(command_obj,0x169,pAVar3,0);
  pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Object::Set(command_obj,0x16c,pAVar3,0);
  bVar1 = Am_Object::Valid(&local_40);
  if (bVar1) {
    pAVar3 = Am_String::operator_cast_to_Am_Wrapper_(&local_48);
    Am_Object::Set(&local_40,0x169,pAVar3,0);
  }
  Am_String::~Am_String(&local_48);
  Am_String::~Am_String(&local_38);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

void
text_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                       bool reload_data, Am_Object obj = Am_No_Object,
                       Am_Value new_value = Am_No_Value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  if (reload_data)
    command_obj.Set(Am_OBJECT_MODIFIED, obj);
  else
    obj = command_obj.Get(Am_OBJECT_MODIFIED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " command " << command_obj << " on obj " << obj << std::endl
              << std::flush;
  }
#endif

  Am_String current_text, orig_text;
  if (selective)
    current_text = obj.Get(Am_TEXT);
  else
    current_text = command_obj.Get(Am_VALUE);
  if (undo)
    orig_text = command_obj.Get(Am_OLD_VALUE);
  else if (reload_data && new_value.Valid())
    orig_text = new_value;
  else
    orig_text = command_obj.Get(Am_VALUE);

  obj.Set(Am_TEXT, (Am_Wrapper *)orig_text);

  command_obj.Set(Am_VALUE, (Am_Wrapper *)orig_text);
  command_obj.Set(Am_OLD_VALUE, (Am_Wrapper *)current_text);
  if (inter.Valid())
    inter.Set(Am_VALUE, (Am_Wrapper *)orig_text);
}